

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

void __thiscall FastLinearExpert::queryNewPredXVar(FastLinearExpert *this,Z *z,Scal hNorm)

{
  Z *this_00;
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  ulong uVar9;
  Index index;
  ulong uVar10;
  long lVar11;
  long lVar12;
  plainobjectbase_evaluator_data<double,_0> pVar13;
  ActualRhsType actualRhs;
  double dVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  Z g;
  Z newSz;
  Z f;
  scalar_sum_op<double,_double> local_119;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_e0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  Scalar local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double *local_80;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_78;
  plainobjectbase_evaluator_data<double,_0> local_70;
  Scalar local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  local_b8 = hNorm;
  local_c8 = pow((this->super_LinearExpert).H + hNorm,(this->super_LinearExpert).alpha);
  local_c8 = local_c8 - local_b8;
  uStack_c0 = extraout_XMM0_Qb;
  dVar14 = pow((this->super_LinearExpert).H,(this->super_LinearExpert).alpha);
  local_c8 = local_c8 / dVar14;
  local_98 = (this->super_LinearExpert).Sh * local_c8;
  uStack_90 = 0;
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_108,
             (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,1)
  ;
  pdVar5 = (this->super_LinearExpert).Sz.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar6 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar9 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (local_108.m_storage.m_rows != uVar9) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,uVar9,1);
    uVar9 = local_108.m_storage.m_rows;
  }
  uVar10 = uVar9 - ((long)uVar9 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar9) {
    lVar11 = 0;
    do {
      pdVar7 = pdVar5 + lVar11;
      dVar14 = pdVar7[1];
      pdVar2 = pdVar6 + lVar11;
      dVar18 = pdVar2[1];
      ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  local_108.m_storage.m_data)->m_storage).m_data + lVar11;
      *ppdVar1 = (double *)(*pdVar2 * local_b8 + *pdVar7 * local_c8);
      ppdVar1[1] = (double *)(dVar18 * local_b8 + dVar14 * local_c8);
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar9) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_108.m_storage.m_data)->
        m_storage).m_data)[uVar10] =
           (double *)(pdVar6[uVar10] * local_b8 + pdVar5[uVar10] * local_c8);
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  local_118.m_storage.m_data = (ResScalar *)0x0;
  local_118.m_storage.m_rows = 0;
  lVar11 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_rows;
  if (lVar11 == 0) {
    pVar13.data = (double *)0x0;
LAB_0014f3ea:
    local_80 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    local_e0.m_lhs =
         (LhsNested)
         (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_e0.m_rhs = (RhsNested)0x1;
    local_78.m_d.data =
         (plainobjectbase_evaluator_data<double,_0>)
         (plainobjectbase_evaluator_data<double,_0>)pVar13.data;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run((long)pVar13.data,
          (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols,(const_blas_data_mapper<double,_long,_0> *)&local_80,
          (const_blas_data_mapper<double,_long,_1> *)&local_e0,local_f8.m_storage.m_data,1,1.0);
    uVar9 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,lVar11,1);
    if (0 < local_f8.m_storage.m_rows) {
      memset(local_f8.m_storage.m_data,0,local_f8.m_storage.m_rows << 3);
    }
    pVar13.data = (double *)
                  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
    if (pVar13.data != (double *)0x1) goto LAB_0014f3ea;
    lVar11 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar11 == 0) {
      dVar14 = 0.0;
    }
    else {
      pdVar5 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      pdVar6 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar14 = *pdVar5 * *pdVar6;
      if (1 < lVar11) {
        lVar12 = 1;
        do {
          dVar14 = dVar14 + pdVar5[lVar12] * pdVar6[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar11 != lVar12);
      }
    }
    *local_f8.m_storage.m_data = dVar14 + *local_f8.m_storage.m_data;
    uVar9 = 1;
  }
  if (local_118.m_storage.m_rows != uVar9) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,uVar9,1);
    uVar9 = local_118.m_storage.m_rows;
  }
  if (0 < (long)uVar9) {
    memset(local_118.m_storage.m_data,0,uVar9 << 3);
  }
  pVar13.data = (double *)
                (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
  if ((plainobjectbase_evaluator_data<double,_0>)pVar13.data ==
      (plainobjectbase_evaluator_data<double,_0>)0x1) {
    if (local_108.m_storage.m_rows == 0) {
      dVar14 = 0.0;
    }
    else {
      pdVar5 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      dVar14 = *pdVar5 * (double)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                  local_108.m_storage.m_data)->m_storage).m_data;
      if (1 < local_108.m_storage.m_rows) {
        uVar9 = 1;
        do {
          dVar14 = dVar14 + pdVar5[uVar9] *
                            (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                       local_108.m_storage.m_data)->m_storage).m_data)[uVar9];
          uVar9 = uVar9 + 1;
        } while (local_108.m_storage.m_rows != uVar9);
      }
    }
    *local_118.m_storage.m_data = dVar14 + *local_118.m_storage.m_data;
  }
  else {
    local_80 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    local_e0.m_lhs = (LhsNested)local_108.m_storage.m_data;
    local_e0.m_rhs = (RhsNested)0x1;
    local_78.m_d.data =
         (plainobjectbase_evaluator_data<double,_0>)
         (plainobjectbase_evaluator_data<double,_0>)pVar13.data;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run((long)pVar13.data,
          (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols,(const_blas_data_mapper<double,_long,_0> *)&local_80,
          (const_blas_data_mapper<double,_long,_1> *)&local_e0,local_118.m_storage.m_data,1,1.0);
  }
  local_e0.m_lhs = (LhsNested)&local_f8;
  if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0) {
    local_68 = 0.0;
    uStack_60 = 0;
  }
  else {
    local_78.m_d.data =
         (plainobjectbase_evaluator_data<double,_0>)
         (plainobjectbase_evaluator_data<double,_0>)local_f8.m_storage.m_data;
    local_70.data =
         (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_e0.m_rhs = z;
    local_68 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
               ::
               run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&local_80,&local_119,&local_e0);
    local_e0.m_lhs = (LhsNested)&local_118;
    uStack_60 = extraout_XMM0_Qb_00;
    if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0) {
      local_78.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)local_118.m_storage.m_data;
      local_70.data =
           (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      local_e0.m_rhs = z;
      local_a8 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)&local_80,&local_119,&local_e0);
      uStack_a0 = extraout_XMM0_Qb_01;
      goto LAB_0014f5d0;
    }
  }
  local_a8 = 0.0;
  uStack_a0 = 0;
LAB_0014f5d0:
  local_e0.m_lhs = (LhsNested)&local_118;
  local_e0.m_rhs = (RhsNested)&local_108;
  if (local_108.m_storage.m_rows == 0) {
    dVar14 = 0.0;
  }
  else {
    local_78.m_d.data =
         (plainobjectbase_evaluator_data<double,_0>)
         (plainobjectbase_evaluator_data<double,_0>)local_118.m_storage.m_data;
    local_70.data = local_108.m_storage.m_data;
    dVar14 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_80,&local_119,&local_e0);
  }
  pdVar6 = local_f8.m_storage.m_data;
  pdVar5 = local_118.m_storage.m_data;
  local_98 = local_98 + local_b8;
  dVar18 = local_c8 / local_b8 + local_68;
  local_38 = 1.0 - local_68 / dVar18;
  dVar18 = local_a8 / dVar18;
  dVar14 = dVar14 - local_a8 * dVar18;
  local_48 = local_a8 * local_38 * local_98 - dVar14;
  local_58 = local_c8 * local_98 - dVar14;
  uStack_50 = uStack_c0;
  uStack_30 = 0;
  auVar15._8_8_ =
       local_68 * local_38 +
       (local_a8 * -2.0 * local_38 + ((local_48 * local_48) / local_58 + dVar14) / local_98) /
       local_98;
  auVar15._0_8_ = 0x3ff0000000000000;
  auVar16._8_8_ = local_c8;
  auVar16._0_8_ = local_98;
  auVar16 = divpd(auVar15,auVar16);
  (this->super_LinearExpert).newGamma = auVar16._8_8_ + auVar16._0_8_;
  this_00 = &(this->super_LinearExpert).dNewGamma;
  uVar9 = local_118.m_storage.m_rows;
  local_a8 = dVar18;
  uStack_40 = uStack_a0;
  if ((this->super_LinearExpert).dNewGamma.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_118.m_storage.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_118.m_storage.m_rows,1);
    uVar9 = (this->super_LinearExpert).dNewGamma.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  }
  dVar20 = (local_48 / local_58 + -1.0) / local_98;
  dVar14 = (local_b8 - local_a8) * dVar20 * dVar20;
  dVar18 = -local_a8 * dVar14 + ((local_b8 - (local_a8 + local_a8)) * dVar20 + local_38) * local_38;
  dVar14 = dVar14 + dVar20 * local_38;
  auVar19._0_8_ = dVar18 + dVar18;
  auVar19._8_8_ = dVar14 + dVar14;
  auVar17._8_8_ = local_c8;
  auVar17._0_8_ = local_c8;
  auVar16 = divpd(auVar19,auVar17);
  dVar14 = auVar16._0_8_;
  dVar18 = auVar16._8_8_;
  pdVar7 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar10 = uVar9 - ((long)uVar9 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar9) {
    lVar11 = 0;
    do {
      pdVar2 = pdVar6 + lVar11;
      dVar20 = pdVar2[1];
      pdVar3 = (double *)((long)pdVar5 + lVar11 * 8);
      dVar8 = pdVar3[1];
      pdVar4 = pdVar7 + lVar11;
      *pdVar4 = *pdVar3 * dVar18 + *pdVar2 * dVar14;
      pdVar4[1] = dVar8 * dVar18 + dVar20 * dVar14;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar9) {
    do {
      pdVar7[uVar10] = *(double *)((long)pdVar5 + uVar10 * 8) * dVar18 + pdVar6[uVar10] * dVar14;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  free(local_118.m_storage.m_data);
  free(local_f8.m_storage.m_data);
  free(local_108.m_storage.m_data);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::queryNewPredXVar(Z const &z, Scal hNorm)
{
    Scal decay = (pow(H+hNorm,alpha) - hNorm) / pow(H,alpha);

    Scal newSh = decay * Sh + hNorm;
    Z newSz = decay * Sz + hNorm * z;

    Z f,g;
    f.noalias() = invSzz * z;
    g.noalias() = invSzz * newSz;

    Scal a = f.dot( z );
    Scal b = g.dot( z );
    Scal c = g.dot( newSz );

    Scal dd = decay / hNorm + a;
    Scal e = 1.0 - a / dd;
    Scal i = b / dd;
    Scal k = c - b*i;
    Scal m = b*e*newSh - k;
    Scal n = decay * newSh - k;

    newGamma = 1.0 / newSh + (a*e + ((k+m*m/n)/newSh-2*b*e)/newSh)/decay;

    Scal o = (m/n - 1.0)/newSh;
    Scal p = (hNorm-i)*o*o;

    dNewGamma = (2.0*(e*(e+(hNorm-2*i)*o)-i*p)/decay) * f + (2.0*(e*o+p)/decay)*g;
}